

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

type * __thiscall duckdb::Deserializer::Read<duckdb::vector<bool,true>>(Deserializer *this)

{
  ulong uVar1;
  long *in_RSI;
  type *in_RDI;
  vector<bool,_std::allocator<bool>_> *unaff_retaddr;
  idx_t i;
  idx_t size;
  vector<bool,_true> *vec;
  undefined8 local_38;
  type *ptVar2;
  
  ptVar2 = in_RDI;
  vector<bool,_true>::vector((vector<bool,_true> *)0xb5085f);
  uVar1 = (**(code **)(*in_RSI + 0x40))();
  for (local_38 = 0; local_38 < uVar1; local_38 = local_38 + 1) {
    Read<bool>((Deserializer *)0xb5089d);
    ::std::vector<bool,_std::allocator<bool>_>::push_back
              (unaff_retaddr,SUB81((ulong)ptVar2 >> 0x38,0));
  }
  (**(code **)(*in_RSI + 0x48))();
  return in_RDI;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}